

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldGenerator::ImmutableStringFieldGenerator
          (ImmutableStringFieldGenerator *this,FieldDescriptor *descriptor,int messageBitIndex,
          int builderBitIndex,Context *context)

{
  ClassNameResolver *pCVar1;
  FieldGeneratorInfo *info;
  Context *context_local;
  int builderBitIndex_local;
  int messageBitIndex_local;
  FieldDescriptor *descriptor_local;
  ImmutableStringFieldGenerator *this_local;
  
  ImmutableFieldGenerator::ImmutableFieldGenerator(&this->super_ImmutableFieldGenerator);
  (this->super_ImmutableFieldGenerator).super_FieldGenerator._vptr_FieldGenerator =
       (_func_int **)&PTR__ImmutableStringFieldGenerator_02a44878;
  this->descriptor_ = descriptor;
  this->message_bit_index_ = messageBitIndex;
  this->builder_bit_index_ = builderBitIndex;
  absl::lts_20250127::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::flat_hash_map(&this->variables_);
  this->context_ = context;
  pCVar1 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar1;
  info = Context::GetFieldGeneratorInfo(context,descriptor);
  anon_unknown_7::SetPrimitiveVariables
            (descriptor,messageBitIndex,builderBitIndex,info,this->name_resolver_,&this->variables_,
             context);
  return;
}

Assistant:

ImmutableStringFieldGenerator::ImmutableStringFieldGenerator(
    const FieldDescriptor* descriptor, int messageBitIndex, int builderBitIndex,
    Context* context)
    : descriptor_(descriptor),
      message_bit_index_(messageBitIndex),
      builder_bit_index_(builderBitIndex),
      context_(context),
      name_resolver_(context->GetNameResolver()) {
  SetPrimitiveVariables(descriptor, messageBitIndex, builderBitIndex,
                        context->GetFieldGeneratorInfo(descriptor),
                        name_resolver_, &variables_, context);
}